

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rbuDeltaApply(char *zSrc,int lenSrc,char *zDelta,int lenDelta,char *zOut)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint ofst;
  uint cnt;
  uint total;
  uint limit;
  char *zOut_local;
  char *pcStack_28;
  int lenDelta_local;
  char *zDelta_local;
  char *pcStack_18;
  int lenSrc_local;
  char *zSrc_local;
  
  ofst = 0;
  zOut_local._4_4_ = lenDelta;
  pcStack_28 = zDelta;
  zDelta_local._4_4_ = lenSrc;
  pcStack_18 = zSrc;
  uVar2 = rbuDeltaGetInt(&stack0xffffffffffffffd8,(int *)((long)&zOut_local + 4));
  if (*pcStack_28 == '\n') {
    pcStack_28 = pcStack_28 + 1;
    zOut_local._4_4_ = zOut_local._4_4_ + -1;
    _total = zOut;
    while (*pcStack_28 != '\0' && 0 < zOut_local._4_4_) {
      uVar3 = rbuDeltaGetInt(&stack0xffffffffffffffd8,(int *)((long)&zOut_local + 4));
      cVar1 = *pcStack_28;
      if (cVar1 == ':') {
        pcStack_28 = pcStack_28 + 1;
        zOut_local._4_4_ = zOut_local._4_4_ + -1;
        if (uVar2 < uVar3 + ofst) {
          return -1;
        }
        if (zOut_local._4_4_ < (int)uVar3) {
          return -1;
        }
        memcpy(_total,pcStack_28,(ulong)uVar3);
        pcStack_28 = pcStack_28 + uVar3;
        zOut_local._4_4_ = zOut_local._4_4_ - uVar3;
      }
      else {
        if (cVar1 == ';') {
          *_total = '\0';
          if (ofst == uVar2) {
            return ofst;
          }
          return -1;
        }
        if (cVar1 != '@') {
          return -1;
        }
        pcStack_28 = pcStack_28 + 1;
        zOut_local._4_4_ = zOut_local._4_4_ + -1;
        uVar4 = rbuDeltaGetInt(&stack0xffffffffffffffd8,(int *)((long)&zOut_local + 4));
        if ((0 < zOut_local._4_4_) && (*pcStack_28 != ',')) {
          return -1;
        }
        pcStack_28 = pcStack_28 + 1;
        zOut_local._4_4_ = zOut_local._4_4_ + -1;
        if (uVar2 < uVar3 + ofst) {
          return -1;
        }
        if (zDelta_local._4_4_ < (int)(uVar4 + uVar3)) {
          return -1;
        }
        memcpy(_total,pcStack_18 + uVar4,(ulong)uVar3);
      }
      _total = _total + uVar3;
      ofst = uVar3 + ofst;
    }
  }
  return -1;
}

Assistant:

static int rbuDeltaApply(
  const char *zSrc,      /* The source or pattern file */
  int lenSrc,            /* Length of the source file */
  const char *zDelta,    /* Delta to apply to the pattern */
  int lenDelta,          /* Length of the delta */
  char *zOut             /* Write the output into this preallocated buffer */
){
  unsigned int limit;
  unsigned int total = 0;
#if RBU_ENABLE_DELTA_CKSUM
  char *zOrigOut = zOut;
#endif

  limit = rbuDeltaGetInt(&zDelta, &lenDelta);
  if( *zDelta!='\n' ){
    /* ERROR: size integer not terminated by "\n" */
    return -1;
  }
  zDelta++; lenDelta--;
  while( *zDelta && lenDelta>0 ){
    unsigned int cnt, ofst;
    cnt = rbuDeltaGetInt(&zDelta, &lenDelta);
    switch( zDelta[0] ){
      case '@': {
        zDelta++; lenDelta--;
        ofst = rbuDeltaGetInt(&zDelta, &lenDelta);
        if( lenDelta>0 && zDelta[0]!=',' ){
          /* ERROR: copy command not terminated by ',' */
          return -1;
        }
        zDelta++; lenDelta--;
        total += cnt;
        if( total>limit ){
          /* ERROR: copy exceeds output file size */
          return -1;
        }
        if( (int)(ofst+cnt) > lenSrc ){
          /* ERROR: copy extends past end of input */
          return -1;
        }
        memcpy(zOut, &zSrc[ofst], cnt);
        zOut += cnt;
        break;
      }
      case ':': {
        zDelta++; lenDelta--;
        total += cnt;
        if( total>limit ){
          /* ERROR:  insert command gives an output larger than predicted */
          return -1;
        }
        if( (int)cnt>lenDelta ){
          /* ERROR: insert count exceeds size of delta */
          return -1;
        }
        memcpy(zOut, zDelta, cnt);
        zOut += cnt;
        zDelta += cnt;
        lenDelta -= cnt;
        break;
      }
      case ';': {
        zDelta++; lenDelta--;
        zOut[0] = 0;
#if RBU_ENABLE_DELTA_CKSUM
        if( cnt!=rbuDeltaChecksum(zOrigOut, total) ){
          /* ERROR:  bad checksum */
          return -1;
        }
#endif
        if( total!=limit ){
          /* ERROR: generated size does not match predicted size */
          return -1;
        }
        return total;
      }
      default: {
        /* ERROR: unknown delta operator */
        return -1;
      }
    }
  }
  /* ERROR: unterminated delta */
  return -1;
}